

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O3

shared_ptr<LNode> __thiscall LParser::shift_VAR(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  LParser *in_RSI;
  shared_ptr<LNode> sVar1;
  undefined1 local_29;
  _Head_base<0UL,_LLexer_*,_false> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  LNodeType local_14;
  
  local_14 = VAR;
  local_28._M_head_impl = (LLexer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<LNodeData<std::__cxx11::string>,std::allocator<LNodeData<std::__cxx11::string>>,LNodeType,std::__cxx11::string&>
            (&_Stack_20,
             (LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)&local_28,
             (allocator<LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_29,&local_14,
             &((in_RSI->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->token)
  ;
  move(in_RSI);
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl = local_28._M_head_impl;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Stack_20._M_pi;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::shift_VAR() {
    auto r = std::make_shared<LNodeData<std::string>>(LNodeType::VAR, this->peek->token);
    this->move();
    return r;
}